

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O1

void Js::AsmJsByteCodeDumper::
     DumpAsmSimdTypedArr<Js::OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
               (OpCodeAsmJs op,
               OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ulong uVar5;
  char16_t *pcVar6;
  undefined *puVar7;
  
  if ((ulong)data->ViewType < 0xf) {
    puVar7 = (&PTR_anon_var_dwarf_33bfb8e_014f2a20)[data->ViewType];
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                ,0x40e,"(false)","false");
    if (!bVar3) goto LAB_007ea290;
    *puVar4 = 0;
    puVar7 = (undefined *)0x0;
  }
  if (Simd128_Select_U4 < op) {
    switch(op) {
    case Simd128_LdArr_U4:
      uVar5 = (ulong)data->Value;
      pcVar6 = L" U4_%d ";
      goto LAB_007ea065;
    case Simd128_LdArrConst_U4:
      uVar5 = (ulong)data->Value;
      pcVar6 = L" U4_%d ";
      goto LAB_007ea25a;
    case Simd128_StArr_U4:
      uVar1 = data->SlotIndex;
      pcVar6 = L"%s[I%d] = ";
      break;
    case Simd128_StArrConst_U4:
      uVar1 = data->SlotIndex;
      pcVar6 = L"%s[%d] = ";
      break;
    default:
      switch(op) {
      case Simd128_LdArr_U8:
        uVar5 = (ulong)data->Value;
        pcVar6 = L" U8_%d ";
        goto LAB_007ea065;
      case Simd128_LdArrConst_U8:
        uVar5 = (ulong)data->Value;
        pcVar6 = L" U8_%d ";
        goto LAB_007ea25a;
      case Simd128_StArr_U8:
        uVar1 = data->SlotIndex;
        pcVar6 = L"%s[I%d] = ";
        break;
      case Simd128_StArrConst_U8:
        uVar1 = data->SlotIndex;
        pcVar6 = L"%s[%d] = ";
        break;
      default:
        switch(op) {
        case Simd128_LdArr_U16:
          uVar5 = (ulong)data->Value;
          pcVar6 = L" U16_%d ";
          goto LAB_007ea065;
        case Simd128_LdArrConst_U16:
          uVar5 = (ulong)data->Value;
          pcVar6 = L" U16_%d ";
          goto LAB_007ea25a;
        case Simd128_StArr_U16:
          uVar1 = data->SlotIndex;
          pcVar6 = L"%s[I%d] = ";
          break;
        case Simd128_StArrConst_U16:
          uVar1 = data->SlotIndex;
          pcVar6 = L"%s[%d] = ";
          break;
        default:
          goto switchD_007e9f7a_default;
        }
        Output::Print(pcVar6,puVar7,(ulong)uVar1);
        uVar5 = (ulong)data->Value;
        pcVar6 = L" U16_%d ";
        goto LAB_007ea247;
      }
      Output::Print(pcVar6,puVar7,(ulong)uVar1);
      uVar5 = (ulong)data->Value;
      pcVar6 = L" U8_%d ";
      goto LAB_007ea247;
    }
    Output::Print(pcVar6,puVar7,(ulong)uVar1);
    uVar5 = (ulong)data->Value;
    pcVar6 = L" U4_%d ";
    goto LAB_007ea247;
  }
  switch(op) {
  case Simd128_LdArr_I4:
    uVar5 = (ulong)data->Value;
    pcVar6 = L" I4_%d ";
    break;
  case Simd128_LdArrConst_I4:
    uVar5 = (ulong)data->Value;
    pcVar6 = L" I4_%d ";
    goto LAB_007ea25a;
  case Simd128_LdArr_F4:
    uVar5 = (ulong)data->Value;
    pcVar6 = L" F4_%d ";
    break;
  case Simd128_LdArrConst_F4:
    uVar5 = (ulong)data->Value;
    pcVar6 = L" F4_%d ";
LAB_007ea25a:
    Output::Print(pcVar6,uVar5);
    uVar1 = data->SlotIndex;
    pcVar6 = L"= %s[%d] ";
    goto LAB_007ea26a;
  case Simd128_StArr_I4:
    uVar1 = data->SlotIndex;
    pcVar6 = L"%s[I%d] = ";
    goto LAB_007ea163;
  case Simd128_StArrConst_I4:
    uVar1 = data->SlotIndex;
    pcVar6 = L"%s[%d] = ";
LAB_007ea163:
    Output::Print(pcVar6,puVar7,(ulong)uVar1);
    uVar5 = (ulong)data->Value;
    pcVar6 = L" I4_%d ";
LAB_007ea247:
    Output::Print(pcVar6,uVar5);
    goto LAB_007ea274;
  case Simd128_StArr_F4:
    uVar1 = data->SlotIndex;
    pcVar6 = L"%s[I%d] = ";
    goto LAB_007ea1a7;
  case Simd128_StArrConst_F4:
    uVar1 = data->SlotIndex;
    pcVar6 = L"%s[%d] = ";
LAB_007ea1a7:
    Output::Print(pcVar6,puVar7,(ulong)uVar1);
    uVar5 = (ulong)data->Value;
    pcVar6 = L" F4_%d ";
    goto LAB_007ea247;
  default:
    switch(op) {
    case Simd128_LdArr_I16:
      uVar5 = (ulong)data->Value;
      pcVar6 = L" I16_%d ";
      goto LAB_007ea065;
    case Simd128_LdArrConst_I16:
      uVar5 = (ulong)data->Value;
      pcVar6 = L" I16_%d ";
      goto LAB_007ea25a;
    case Simd128_StArr_I16:
      uVar1 = data->SlotIndex;
      pcVar6 = L"%s[I%d] = ";
      break;
    case Simd128_StArrConst_I16:
      uVar1 = data->SlotIndex;
      pcVar6 = L"%s[%d] = ";
      break;
    default:
      switch(op) {
      case Simd128_LdArr_I8:
        uVar5 = (ulong)data->Value;
        pcVar6 = L" I8_%d ";
        goto LAB_007ea065;
      case Simd128_LdArrConst_I8:
        uVar5 = (ulong)data->Value;
        pcVar6 = L" I8_%d ";
        goto LAB_007ea25a;
      case Simd128_StArr_I8:
        uVar1 = data->SlotIndex;
        pcVar6 = L"%s[I%d] = ";
        break;
      case Simd128_StArrConst_I8:
        uVar1 = data->SlotIndex;
        pcVar6 = L"%s[%d] = ";
        break;
      default:
switchD_007e9f7a_default:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                    ,0x432,"(false)","false");
        if (!bVar3) {
LAB_007ea290:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
        goto LAB_007ea274;
      }
      Output::Print(pcVar6,puVar7,(ulong)uVar1);
      uVar5 = (ulong)data->Value;
      pcVar6 = L" I8_%d ";
      goto LAB_007ea247;
    }
    Output::Print(pcVar6,puVar7,(ulong)uVar1);
    uVar5 = (ulong)data->Value;
    pcVar6 = L" I16_%d ";
    goto LAB_007ea247;
  }
LAB_007ea065:
  Output::Print(pcVar6,uVar5);
  uVar1 = data->SlotIndex;
  pcVar6 = L"= %s[I%d] ";
LAB_007ea26a:
  Output::Print(pcVar6,puVar7,(ulong)uVar1);
LAB_007ea274:
  Output::Print(L" %d bytes ",(ulong)(uint)(int)data->DataWidth);
  return;
}

Assistant:

void AsmJsByteCodeDumper::DumpAsmSimdTypedArr(OpCodeAsmJs op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        const char16* heapTag = nullptr;

        switch (data->ViewType)
        {
        case ArrayBufferView::TYPE_INT8:
        case ArrayBufferView::TYPE_INT8_TO_INT64:
            heapTag = _u("HEAP8"); break;
        case ArrayBufferView::TYPE_UINT8:
        case ArrayBufferView::TYPE_UINT8_TO_INT64:
            heapTag = _u("HEAPU8"); break;
        case ArrayBufferView::TYPE_INT16:
        case ArrayBufferView::TYPE_INT16_TO_INT64:
            heapTag = _u("HEAP16"); break;
        case ArrayBufferView::TYPE_UINT16:
        case ArrayBufferView::TYPE_UINT16_TO_INT64:
            heapTag = _u("HEAPU16"); break;
        case ArrayBufferView::TYPE_INT32:
        case ArrayBufferView::TYPE_INT32_TO_INT64:
            heapTag = _u("HEAP32"); break;
        case ArrayBufferView::TYPE_UINT32:
        case ArrayBufferView::TYPE_UINT32_TO_INT64:
            heapTag = _u("HEAPU32"); break;
        case ArrayBufferView::TYPE_FLOAT32:
            heapTag = _u("HEAPF32"); break;
        case ArrayBufferView::TYPE_FLOAT64:
            heapTag = _u("HEAPF64"); break;
        case ArrayBufferView::TYPE_INT64:
            heapTag = _u("HEAPI64"); break;
        default:
            Assert(false);
            __assume(false);
            break;
        }

#define SIMD_DUMP_ARR_I4 DumpInt32x4Reg
#define SIMD_DUMP_ARR_I8 DumpInt16x8Reg
#define SIMD_DUMP_ARR_I16 DumpInt8x16Reg
#define SIMD_DUMP_ARR_U4 DumpUint32x4Reg
#define SIMD_DUMP_ARR_U8 DumpUint16x8Reg
#define SIMD_DUMP_ARR_U16 DumpUint8x16Reg
#define SIMD_DUMP_ARR_F4 DumpFloat32x4Reg
#define SIMD_DUMP_ARR_D2 DumpFloat64x2Reg
#define SIMD_DUMP_ARR_I2 DumpInt64x2Reg
#define SIMD_DUMP_REG(type) SIMD_DUMP_ARR_##type(data->Value)
#define SIMD_DUMP_ARR_VALUE(type) \
        case OpCodeAsmJs::Simd128_LdArr_##type:\
            SIMD_DUMP_REG(type); Output::Print(_u("= %s[I%d] "), heapTag, data->SlotIndex); break;\
        case OpCodeAsmJs::Simd128_LdArrConst_##type:\
            SIMD_DUMP_REG(type); Output::Print(_u("= %s[%d] "), heapTag, data->SlotIndex); break;\
        case OpCodeAsmJs::Simd128_StArr_##type:\
            Output::Print(_u("%s[I%d] = "), heapTag, data->SlotIndex); SIMD_DUMP_REG(type); break;\
        case OpCodeAsmJs::Simd128_StArrConst_##type:\
            Output::Print(_u("%s[%d] = "), heapTag, data->SlotIndex); SIMD_DUMP_REG(type); break;\

        switch (op)
        {
            SIMD_DUMP_ARR_VALUE(I4)
            SIMD_DUMP_ARR_VALUE(I8)
            SIMD_DUMP_ARR_VALUE(I16)
            SIMD_DUMP_ARR_VALUE(U4)
            SIMD_DUMP_ARR_VALUE(U8)
            SIMD_DUMP_ARR_VALUE(U16)
            SIMD_DUMP_ARR_VALUE(F4)
            //SIMD_DUMP_ARR_VALUE(D2)
        default:
            Assert(false);
            __assume(false);
            break;
        }

        // data width
        Output::Print(_u(" %d bytes "), data->DataWidth);
    }